

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

void __thiscall
basist::decoder_etc_block::get_block_colors
          (decoder_etc_block *this,color32 *pBlock_colors,uint32_t subblock_index)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  int in_EDX;
  undefined8 in_RSI;
  decoder_etc_block *in_RDI;
  int *pInten_table;
  color32 b;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined8 in_stack_ffffffffffffff98;
  uint32_t idx;
  undefined1 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa1;
  uint16_t in_stack_ffffffffffffffa2;
  undefined4 in_stack_ffffffffffffffa4;
  uint32_t in_stack_ffffffffffffffb4;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  anon_union_4_3_898e29d3_for_color32_0 local_18;
  int local_14;
  undefined8 local_10;
  
  uVar2 = (uint32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  idx = (uint32_t)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  local_14 = in_EDX;
  local_10 = in_RSI;
  color32::color32((color32 *)&local_18.field_0);
  bVar1 = get_diff_bit(in_RDI);
  if (bVar1) {
    if (local_14 == 0) {
      get_base5_color((decoder_etc_block *)
                      CONCAT44(in_stack_ffffffffffffffa4,
                               CONCAT22(in_stack_ffffffffffffffa2,
                                        CONCAT11(in_stack_ffffffffffffffa1,in_stack_ffffffffffffffa0
                                                ))));
      unpack_color5((color32 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    (uint16_t)(uVar2 >> 0x10),SUB41(uVar2 >> 8,0));
    }
    else {
      get_base5_color((decoder_etc_block *)
                      CONCAT44(in_stack_ffffffffffffffa4,
                               CONCAT22(in_stack_ffffffffffffffa2,
                                        CONCAT11(in_stack_ffffffffffffffa1,in_stack_ffffffffffffffa0
                                                ))));
      get_delta3_color((decoder_etc_block *)
                       CONCAT44(in_stack_ffffffffffffffa4,
                                CONCAT22(in_stack_ffffffffffffffa2,
                                         CONCAT11(in_stack_ffffffffffffffa1,
                                                  in_stack_ffffffffffffffa0))));
      unpack_color5((color32 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    (uint16_t)((ulong)in_stack_ffffffffffffffb8 >> 0x30),
                    (uint16_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                    SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x18,0),in_stack_ffffffffffffffb4);
    }
  }
  else {
    get_base4_color((decoder_etc_block *)
                    CONCAT44(in_stack_ffffffffffffffa4,
                             CONCAT22(in_stack_ffffffffffffffa2,
                                      CONCAT11(in_stack_ffffffffffffffa1,in_stack_ffffffffffffffa0))
                            ),idx);
    local_18.field_0 =
         (anon_struct_4_4_d83cdc77_for_anon_union_4_3_898e29d3_for_color32_0_0)
         unpack_color4(in_stack_ffffffffffffffa2,(bool)in_stack_ffffffffffffffa1,idx);
  }
  uVar2 = get_inten_table((decoder_etc_block *)
                          CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),uVar2);
  lVar6 = (ulong)uVar2 * 0x10;
  piVar5 = (int *)(g_etc1_inten_tables + lVar6);
  iVar3 = clamp255((local_18.m & 0xff) + *piVar5);
  iVar4 = clamp255((local_18.m >> 8 & 0xff) + *piVar5);
  clamp255((local_18.m >> 0x10 & 0xff) + *piVar5);
  color32::set_noclamp_rgba
            ((color32 *)CONCAT44(iVar4,iVar3),(uint32_t)((ulong)local_10 >> 0x20),(uint32_t)local_10
             ,0,0x167cb4);
  clamp255((local_18.m & 0xff) + *(int *)(g_etc1_inten_tables + lVar6 + 4));
  clamp255((local_18.m >> 8 & 0xff) + *(int *)(g_etc1_inten_tables + lVar6 + 4));
  clamp255((local_18.m >> 0x10 & 0xff) + *(int *)(g_etc1_inten_tables + lVar6 + 4));
  color32::set_noclamp_rgba
            ((color32 *)CONCAT44(iVar4,iVar3),(uint32_t)((ulong)local_10 >> 0x20),(uint32_t)local_10
             ,0,0x167d1a);
  clamp255((local_18.m & 0xff) + *(int *)(g_etc1_inten_tables + lVar6 + 8));
  clamp255((local_18.m >> 8 & 0xff) + *(int *)(g_etc1_inten_tables + lVar6 + 8));
  clamp255((local_18.m >> 0x10 & 0xff) + *(int *)(g_etc1_inten_tables + lVar6 + 8));
  color32::set_noclamp_rgba
            ((color32 *)CONCAT44(iVar4,iVar3),(uint32_t)((ulong)local_10 >> 0x20),(uint32_t)local_10
             ,0,0x167d80);
  clamp255((local_18.m & 0xff) + *(int *)(g_etc1_inten_tables + lVar6 + 0xc));
  clamp255((local_18.m >> 8 & 0xff) + *(int *)(g_etc1_inten_tables + lVar6 + 0xc));
  clamp255((local_18.m >> 0x10 & 0xff) + *(int *)(g_etc1_inten_tables + lVar6 + 0xc));
  color32::set_noclamp_rgba
            ((color32 *)CONCAT44(iVar4,iVar3),(uint32_t)((ulong)local_10 >> 0x20),(uint32_t)local_10
             ,0,0x167de6);
  return;
}

Assistant:

void get_block_colors(color32* pBlock_colors, uint32_t subblock_index) const
		{
			color32 b;

			if (get_diff_bit())
			{
				if (subblock_index)
					unpack_color5(b, get_base5_color(), get_delta3_color(), true, 255);
				else
					unpack_color5(b, get_base5_color(), true);
			}
			else
			{
				b = unpack_color4(get_base4_color(subblock_index), true, 255);
			}

			const int* pInten_table = g_etc1_inten_tables[get_inten_table(subblock_index)];

			pBlock_colors[0].set_noclamp_rgba(clamp255(b.r + pInten_table[0]), clamp255(b.g + pInten_table[0]), clamp255(b.b + pInten_table[0]), 255);
			pBlock_colors[1].set_noclamp_rgba(clamp255(b.r + pInten_table[1]), clamp255(b.g + pInten_table[1]), clamp255(b.b + pInten_table[1]), 255);
			pBlock_colors[2].set_noclamp_rgba(clamp255(b.r + pInten_table[2]), clamp255(b.g + pInten_table[2]), clamp255(b.b + pInten_table[2]), 255);
			pBlock_colors[3].set_noclamp_rgba(clamp255(b.r + pInten_table[3]), clamp255(b.g + pInten_table[3]), clamp255(b.b + pInten_table[3]), 255);
		}